

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_astar.hpp
# Opt level: O3

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
compress::CompressAstar<Tiles>::search
          (vector<Tiles::State,_std::allocator<Tiles::State>_> *__return_storage_ptr__,
          CompressAstar<Tiles> *this,State *init)

{
  size_t *psVar1;
  pointer *ppSVar2;
  char cVar3;
  int iVar4;
  iterator iVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined8 uVar9;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *pvVar10;
  pair<bool,_bool> pVar11;
  int i;
  long lVar12;
  long lVar13;
  Tiles *pTVar14;
  CompressClosedList<Node<Tiles>_> *this_00;
  long lVar15;
  vector<Tiles::State,std::allocator<Tiles::State>> *this_01;
  State state;
  Node<Tiles> n;
  Node<Tiles> parent;
  State parent_state;
  State local_aa;
  Node<Tiles> local_98;
  CompressOpenList<Node<Tiles>_> *local_80;
  Node<Tiles> local_78;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *local_60;
  CompressClosedList<Node<Tiles>_> *local_58;
  vector<Tiles::State,std::allocator<Tiles::State>> *local_50;
  State local_42;
  
  uVar9 = local_98._0_8_;
  lVar12 = 0;
  local_98.g = '\0';
  local_98.f = init->h;
  local_98._3_5_ = SUB85(uVar9,3);
  local_98.pop = -1;
  init->tiles[init->blank] = '\0';
  local_98.parent_packed.word = 0;
  do {
    local_98.parent_packed.word = (long)init->tiles[lVar12] | local_98.parent_packed.word << 4;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x10);
  local_80 = &this->open;
  local_98.packed.word = local_98.parent_packed.word;
  local_60 = __return_storage_ptr__;
  CompressOpenList<Node<Tiles>_>::push(local_80,&local_98);
  this_01 = (vector<Tiles::State,std::allocator<Tiles::State>> *)&this->path;
  if (((this->open).size != 0) &&
     ((this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    this_00 = &this->closed;
    local_58 = this_00;
    local_50 = this_01;
    do {
      CompressOpenList<Node<Tiles>_>::pop(&local_98,local_80);
      pVar11 = CompressClosedList<Node<Tiles>_>::find_insert(this_00,&local_98);
      if (((ushort)pVar11 & 1) == 0) {
LAB_00107946:
        Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_aa,local_98.packed);
        cVar7 = local_aa.h;
        if (local_aa.h == '\0') {
          iVar5._M_current =
               (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Tiles::State,std::allocator<Tiles::State>>::
            _M_realloc_insert<Tiles::State_const&>(this_01,iVar5,&local_aa);
          }
          else {
            (iVar5._M_current)->blank = local_aa.blank;
            (iVar5._M_current)->h = local_aa.h;
            *(undefined8 *)(iVar5._M_current)->tiles = local_aa.tiles._0_8_;
            *(undefined8 *)((iVar5._M_current)->tiles + 8) = local_aa.tiles._8_8_;
            ppSVar2 = &(this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppSVar2 = *ppSVar2 + 1;
          }
          while (local_98.packed.word != local_98.parent_packed.word) {
            CompressClosedList<Node<Tiles>_>::trace_parent(&local_78,this_00,&local_98);
            Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&local_42,local_78.packed);
            iVar5._M_current =
                 (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<Tiles::State,std::allocator<Tiles::State>>::
              _M_realloc_insert<Tiles::State_const&>(this_01,iVar5,&local_42);
            }
            else {
              (iVar5._M_current)->blank = local_42.blank;
              (iVar5._M_current)->h = local_42.h;
              *(undefined8 *)(iVar5._M_current)->tiles = local_42.tiles._0_8_;
              *(undefined8 *)((iVar5._M_current)->tiles + 8) = local_42.tiles._8_8_;
              ppSVar2 = &(this->path).
                         super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppSVar2 = *ppSVar2 + 1;
            }
            local_98.g = local_78.g;
            local_98.f = local_78.f;
            local_98.pop = local_78.pop;
            local_98._3_5_ = local_78._3_5_;
            local_98.parent_packed.word = local_78.parent_packed.word;
            local_98.packed.word = local_78.packed.word;
          }
          CompressClosedList<Node<Tiles>_>::print_statistics(this_00);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
          ::clear((_Rb_tree<int,_std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>,_std::_Select1st<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_named_fstream,_std::less<int>,_std::allocator<std::pair<const_int,_named_fstream>_>_>_>_>_>
                   *)local_80);
          (this->open).size = 0;
          rmdir("open_list_buckets");
          CompressClosedList<Node<Tiles>_>::clear(this_00);
        }
        else {
          psVar1 = &(this->super_SearchAlg<Tiles>).expd;
          *psVar1 = *psVar1 + 1;
          pTVar14 = (this->super_SearchAlg<Tiles>).dom;
          cVar6 = local_aa.blank;
          lVar12 = (long)local_aa.blank;
          if (0 < *(int *)(pTVar14 + lVar12 * 0x14 + 0x4440)) {
            lVar15 = 0;
            do {
              iVar4 = *(int *)(pTVar14 + lVar15 * 4 + lVar12 * 0x14 + 0x4444);
              if (iVar4 != local_98.pop) {
                psVar1 = &(this->super_SearchAlg<Tiles>).gend;
                *psVar1 = *psVar1 + 1;
                cVar8 = local_aa.h;
                cVar3 = local_aa.tiles[iVar4];
                local_aa.tiles[lVar12] = cVar3;
                local_aa.h = local_aa.h +
                             (char)pTVar14[(long)local_aa.blank * 4 +
                                           (long)cVar3 * 0x400 + (long)iVar4 * 0x40 + 0x440];
                local_aa.blank = (char)iVar4;
                local_78.g = local_98.g + '\x01';
                local_78.f = local_98.g + '\x01' + local_aa.h;
                local_78.pop = cVar6;
                local_aa.tiles[(char)iVar4] = '\0';
                lVar13 = 0;
                local_78.packed.word = 0;
                do {
                  local_78.packed.word = (long)local_aa.tiles[lVar13] | local_78.packed.word << 4;
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 0x10);
                local_78.parent_packed.word = local_98.packed.word;
                CompressOpenList<Node<Tiles>_>::push(local_80,&local_78);
                local_aa.h = cVar8;
                local_aa.tiles[local_aa.blank] = local_aa.tiles[lVar12];
                local_aa._16_2_ = CONCAT11(local_aa.h,cVar6);
                pTVar14 = (this->super_SearchAlg<Tiles>).dom;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < *(int *)(pTVar14 + lVar12 * 0x14 + 0x4440));
          }
        }
        this_00 = local_58;
        this_01 = local_50;
        if (cVar7 == '\0') break;
      }
      else if (((ushort)pVar11 >> 8 & 1) != 0) {
        psVar1 = &(this->super_SearchAlg<Tiles>).reopd;
        *psVar1 = *psVar1 + 1;
        goto LAB_00107946;
      }
      if (((this->open).size == 0) ||
         ((this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
          super__Vector_impl_data._M_start)) break;
    } while( true );
  }
  pvVar10 = local_60;
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
            (local_60,(vector<Tiles::State,_std::allocator<Tiles::State>_> *)this_01);
  return pvVar10;
}

Assistant:

std::vector<typename D::State> search(typename D::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (!open.isempty() && path.size() == 0) {
                Node<D> n = open.pop();

                bool found, reopened;
                tie(found, reopened) = closed.find_insert(n);
                if (found && reopened) this->reopd++;
                if (found && !reopened) continue;

                typename D::State state;
                this->dom.unpack(state, n.packed);

                if (this->dom.isgoal(state)) {
                    // trace path here
                    path.push_back(state);
                    while(n.packed != n.parent_packed) {
                        Node<D> parent = closed.trace_parent(n);
                        typename D::State parent_state;
                        this->dom.unpack(parent_state, parent.packed);
                        path.push_back(parent_state);
                        n = parent;
                    }
                    closed.print_statistics();
                    open.clear();
                    closed.clear();
                    break;
                }

                this->expd++;
                for (int i = 0; i < this->dom.nops(state); i++) {
                    int op = this->dom.nthop(state, i);
                    if (op == n.pop)
                        continue;
                    this->gend++;
                    Edge<D> e = this->dom.apply(state, op);
                    open.push(wrap(state, &n, e.cost, e.pop));
                    this->dom.undo(state, e);
                }
            }
            return path;
        }